

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O0

XMLSize_t __thiscall xercesc_4_0::CMStateSet::hashCode(CMStateSet *this)

{
  ulong local_38;
  XMLSize_t subIndex_1;
  XMLSize_t subIndex;
  XMLSize_t index_1;
  XMLSize_t index;
  XMLSize_t hash;
  CMStateSet *this_local;
  
  index = 0;
  if (this->fDynamicBuffer == (CMDynamicBuffer *)0x0) {
    for (index_1 = 0; index_1 < 4; index_1 = index_1 + 1) {
      index = (long)this->fBits[index_1] + index * 0x1f;
    }
  }
  else {
    for (subIndex = 0; subIndex < this->fDynamicBuffer->fArraySize; subIndex = subIndex + 1) {
      if (this->fDynamicBuffer->fBitArray[subIndex] == (XMLInt32 *)0x0) {
        for (subIndex_1 = 0; subIndex_1 < 0x20; subIndex_1 = subIndex_1 + 1) {
          index = index * 0x1f;
        }
      }
      else {
        for (local_38 = 0; local_38 < 0x20; local_38 = local_38 + 1) {
          index = (long)this->fDynamicBuffer->fBitArray[subIndex][local_38] + index * 0x1f;
        }
      }
    }
  }
  return index;
}

Assistant:

XMLSize_t hashCode() const
    {
        XMLSize_t hash = 0;
        if(fDynamicBuffer==0)
        {
            for (XMLSize_t index = 0; index<CMSTATE_CACHED_INT32_SIZE; index++)
                hash = fBits[index] + hash * 31;
        }
        else
        {
            for (XMLSize_t index = 0; index<fDynamicBuffer->fArraySize; index++)
            {
                if(fDynamicBuffer->fBitArray[index]==NULL)
                    // simulates the iteration on the missing bits
                    for(XMLSize_t subIndex=0;subIndex < CMSTATE_BITFIELD_INT32_SIZE; subIndex++)
                        hash *= 31;
                else
                    for(XMLSize_t subIndex=0;subIndex < CMSTATE_BITFIELD_INT32_SIZE; subIndex++)
                        hash = fDynamicBuffer->fBitArray[index][subIndex] + hash * 31;
            }
        }
        return hash;
    }